

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateBuilderMembers
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  Type type;
  int iVar4;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view begin_varname_05;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined2 local_218;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined2 local_1c8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined2 local_178;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined2 local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  vars = &(this->super_ImmutablePrimitiveFieldGenerator).variables_;
  text._M_str = 
  "private $field_list_type$ $name$_ = $empty_list$;\nprivate void ensure$capitalized_name$IsMutable() {\n  if (!$name$_.isModifiable()) {\n    $name$_ = makeMutableCopy($name$_);\n  }\n  $set_has_field_bit_builder$\n}\n"
  ;
  text._M_len = 0xd2;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  type = GetType((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  iVar4 = FixedSize(type);
  if (iVar4 != -1) {
    text_00._M_str =
         "private void ensure$capitalized_name$IsMutable(int capacity) {\n  if (!$name$_.isModifiable()) {\n    $name$_ = makeMutableCopy($name$_, capacity);\n  }\n  $set_has_field_bit_builder$\n}\n"
    ;
    text_00._M_len = 0xb6;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_00);
  }
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pCVar2 = (this->super_ImmutablePrimitiveFieldGenerator).context_;
  local_80[4] = (pCVar2->options_).opensource_runtime;
  local_80[5] = (pCVar2->options_).annotate_code;
  local_80[0] = (pCVar2->options_).generate_immutable_code;
  local_80[1] = (pCVar2->options_).generate_mutable_code;
  local_80[2] = (pCVar2->options_).generate_shared_code;
  local_80[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,(Options *)local_80,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  text_01._M_str =
       "$deprecation$public java.util.List<$boxed_type$>\n    ${$get$capitalized_name$List$}$() {\n  $name$_.makeImmutable();\n  return $name$_;\n}\n"
  ;
  text_01._M_len = 0x88;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,
             (this->super_ImmutablePrimitiveFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pCVar2 = (this->super_ImmutablePrimitiveFieldGenerator).context_;
  local_d0[4] = (pCVar2->options_).opensource_runtime;
  local_d0[5] = (pCVar2->options_).annotate_code;
  local_d0[0] = (pCVar2->options_).generate_immutable_code;
  local_d0[1] = (pCVar2->options_).generate_mutable_code;
  local_d0[2] = (pCVar2->options_).generate_shared_code;
  local_d0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_88._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_COUNT,(Options *)local_d0,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  text_02._M_str =
       "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
  ;
  text_02._M_len = 0x58;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,
             (this->super_ImmutablePrimitiveFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pCVar2 = (this->super_ImmutablePrimitiveFieldGenerator).context_;
  local_120[4] = (pCVar2->options_).opensource_runtime;
  local_120[5] = (pCVar2->options_).annotate_code;
  local_120[0] = (pCVar2->options_).generate_immutable_code;
  local_120[1] = (pCVar2->options_).generate_mutable_code;
  local_120[2] = (pCVar2->options_).generate_shared_code;
  local_120[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_118._M_p = (pointer)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_d8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_INDEXED_GETTER,(Options *)local_120,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  text_03._M_str =
       "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return $repeated_get$(index);\n}\n"
  ;
  text_03._M_len = 0x66;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_03);
  begin_varname_01._M_str = "{";
  begin_varname_01._M_len = 1;
  end_varname_01._M_str = "}";
  end_varname_01._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_01,end_varname_01,
             (this->super_ImmutablePrimitiveFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pCVar2 = (this->super_ImmutablePrimitiveFieldGenerator).context_;
  local_170[4] = (pCVar2->options_).opensource_runtime;
  local_170[5] = (pCVar2->options_).annotate_code;
  local_170[0] = (pCVar2->options_).generate_immutable_code;
  local_170[1] = (pCVar2->options_).generate_mutable_code;
  local_170[2] = (pCVar2->options_).generate_shared_code;
  local_170[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_168._M_p = (pointer)&local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_148._M_p = (pointer)&local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_128._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_128._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_INDEXED_SETTER,(Options *)local_170,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  text_04._M_str =
       "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    int index, $type$ value) {\n  $null_check$\n  ensure$capitalized_name$IsMutable();\n  $repeated_set$(index, value);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_04._M_len = 0xec;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  begin_varname_02._M_str = "{";
  begin_varname_02._M_len = 1;
  end_varname_02._M_str = "}";
  end_varname_02._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_02,end_varname_02,
             (this->super_ImmutablePrimitiveFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pCVar2 = (this->super_ImmutablePrimitiveFieldGenerator).context_;
  local_1c0[4] = (pCVar2->options_).opensource_runtime;
  local_1c0[5] = (pCVar2->options_).annotate_code;
  local_1c0[0] = (pCVar2->options_).generate_immutable_code;
  local_1c0[1] = (pCVar2->options_).generate_mutable_code;
  local_1c0[2] = (pCVar2->options_).generate_shared_code;
  local_1c0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_1b8._M_p = (pointer)&local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_198._M_p = (pointer)&local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_178._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_178._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_ADDER,(Options *)local_1c0,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  text_05._M_str =
       "$deprecation$public Builder ${$add$capitalized_name$$}$($type$ value) {\n  $null_check$\n  ensure$capitalized_name$IsMutable();\n  $repeated_add$(value);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_05._M_len = 0xd5;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_05);
  begin_varname_03._M_str = "{";
  begin_varname_03._M_len = 1;
  end_varname_03._M_str = "}";
  end_varname_03._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_03,end_varname_03,
             (this->super_ImmutablePrimitiveFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pCVar2 = (this->super_ImmutablePrimitiveFieldGenerator).context_;
  local_210[4] = (pCVar2->options_).opensource_runtime;
  local_210[5] = (pCVar2->options_).annotate_code;
  local_210[0] = (pCVar2->options_).generate_immutable_code;
  local_210[1] = (pCVar2->options_).generate_mutable_code;
  local_210[2] = (pCVar2->options_).generate_shared_code;
  local_210[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_208._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_1e8._M_p = (pointer)&local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_1c8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_1c8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_MULTI_ADDER,(Options *)local_210,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  text_06._M_str =
       "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n    java.lang.Iterable<? extends $boxed_type$> values) {\n  ensure$capitalized_name$IsMutable();\n  com.google.protobuf.AbstractMessageLite.Builder.addAll(\n      values, $name$_);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_06._M_len = 300;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_06);
  begin_varname_04._M_str = "{";
  begin_varname_04._M_len = 1;
  end_varname_04._M_str = "}";
  end_varname_04._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_04,end_varname_04,
             (this->super_ImmutablePrimitiveFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pCVar2 = (this->super_ImmutablePrimitiveFieldGenerator).context_;
  local_260[4] = (pCVar2->options_).opensource_runtime;
  local_260[5] = (pCVar2->options_).annotate_code;
  local_260[0] = (pCVar2->options_).generate_immutable_code;
  local_260[1] = (pCVar2->options_).generate_mutable_code;
  local_260[2] = (pCVar2->options_).generate_shared_code;
  local_260[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_258._M_p = (pointer)&local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_238._M_p = (pointer)&local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_218._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_218._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,(Options *)local_260,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != &local_228) {
    operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_p != &local_248) {
    operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
  }
  text_07._M_str =
       "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $name$_ = $empty_list$;\n  $clear_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
  ;
  text_07._M_len = 0x98;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_07);
  begin_varname_05._M_str = "{";
  begin_varname_05._M_len = 1;
  end_varname_05._M_str = "}";
  end_varname_05._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_05,end_varname_05,
             (this->super_ImmutablePrimitiveFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // We use a ProtobufArrayList because it starts as a mutable list that can be
  // switched to immutable when references are handed out. This allows copy-free
  // sharing. A bit in the bitfield tracks whether there are any items in the
  // list. The presence bit allows us to skip work on blocks of 32 fields by
  // by checking if the entire bit-field int == 0 (none of the fields are
  // present).
  printer->Print(variables_,
                 "private $field_list_type$ $name$_ = $empty_list$;\n"
                 "private void ensure$capitalized_name$IsMutable() {\n"
                 "  if (!$name$_.isModifiable()) {\n"
                 "    $name$_ = makeMutableCopy($name$_);\n"
                 "  }\n"
                 "  $set_has_field_bit_builder$\n"
                 "}\n");
  if (FixedSize(GetType(descriptor_)) != -1) {
    printer->Print(
        variables_,
        "private void ensure$capitalized_name$IsMutable(int capacity) {\n"
        "  if (!$name$_.isModifiable()) {\n"
        "    $name$_ = makeMutableCopy($name$_, capacity);\n"
        "  }\n"
        "  $set_has_field_bit_builder$\n"
        "}\n");
  }

  // Note:  We return an unmodifiable list because otherwise the caller
  //   could hold on to the returned list and modify it after the message
  //   has been built, thus mutating the message which is supposed to be
  //   immutable.
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$public java.util.List<$boxed_type$>\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  $name$_.makeImmutable();\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $repeated_get$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    int index, $type$ value) {\n"
                 "  $null_check$\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $repeated_set$(index, value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$add$capitalized_name$$}$($type$ value) {\n"
                 "  $null_check$\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $repeated_add$(value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n"
                 "    java.lang.Iterable<? extends $boxed_type$> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  com.google.protobuf.AbstractMessageLite.Builder.addAll(\n"
                 "      values, $name$_);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $name$_ = $empty_list$;\n"
      "  $clear_has_field_bit_builder$\n"
      "  $on_changed$\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}